

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O0

state_status_t
tchecker::ta::prev(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
                  sync_id_t *sync_id,clock_constraint_container_t *src_invariant,
                  clock_constraint_container_t *guard,clock_reset_container_t *reset,
                  clock_constraint_container_t *tgt_invariant,incoming_edges_value_t *v)

{
  allocator<unsigned_int> *this;
  pointer this_00;
  bool bVar1;
  unsigned_short uVar2;
  capacity_t_conflict i_00;
  uint uVar3;
  loc_id_t lVar4;
  process_id_t i_01;
  int iVar5;
  __tuple_element_t<0UL,_tuple<sync_edges_t,_range_t<values_iterator_t,_values_iterator_t>_>_>
  *sync_edges_00;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar6;
  EVP_PKEY_CTX *pEVar7;
  make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *pmVar8;
  edges_iterator_t *peVar9;
  element_type *peVar10;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *this_01;
  uint *puVar11;
  values_iterator_t *pvVar12;
  make_array_t<int,_4UL,_tchecker::intval_base_t> *this_02;
  int *piVar13;
  vloc_t *vloc_00;
  intval_t *intval_00;
  allocator<int> local_179;
  state_status_t status;
  vector<int,_std::allocator<int>_> intval_src;
  undefined1 local_158 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vloc_src;
  iterator iStack_138;
  integer_t i;
  values_iterator_t __end2_1;
  values_iterator_t __begin2_1;
  type *__range2_1;
  undefined1 local_118 [4];
  intvar_id_t id;
  __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_108;
  edge_const_shared_ptr_t *e;
  edges_iterator_t __end2;
  edges_iterator_t __begin2;
  range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t> *__range2;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> intval_tgt;
  allocator<unsigned_int> local_81;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vloc_tgt;
  type *valuation;
  type *sync_edges;
  clock_constraint_container_t *src_invariant_local;
  sync_id_t *sync_id_local;
  vedge_sptr_t *vedge_local;
  intval_sptr_t *intval_local;
  vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  sync_edges_00 =
       std::
       get<0ul,tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t,tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t>>
                 (v);
  vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                get<1ul,tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t,tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t>>
                          (v);
  pmVar6 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator->(vloc);
  uVar3 = array_capacity_t<unsigned_int>::capacity((array_capacity_t<unsigned_int> *)pmVar6);
  std::allocator<unsigned_int>::allocator(&local_81);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,(ulong)uVar3,&local_81)
  ;
  std::allocator<unsigned_int>::~allocator(&local_81);
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator*(vloc);
  copy((EVP_PKEY_CTX *)local_80,pEVar7);
  pmVar8 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator->(intval);
  uVar2 = array_capacity_t<unsigned_short>::capacity((array_capacity_t<unsigned_short> *)pmVar8);
  std::allocator<int>::allocator((allocator<int> *)((long)&__range2 + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b0,(ulong)uVar2,
             (allocator<int> *)((long)&__range2 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range2 + 7));
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator*(intval);
  copy((EVP_PKEY_CTX *)local_b0,pEVar7);
  peVar9 = range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::
           begin(&sync_edges_00->edges);
  syncprod::edges_iterator_t::edges_iterator_t((edges_iterator_t *)&__end2._sync_it,peVar9);
  peVar9 = range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::end
                     (&sync_edges_00->edges);
  syncprod::edges_iterator_t::edges_iterator_t((edges_iterator_t *)&e,peVar9);
  while (bVar1 = syncprod::edges_iterator_t::operator!=
                           ((edges_iterator_t *)&__end2._sync_it,(edges_iterator_t *)&e), bVar1) {
    syncprod::edges_iterator_t::operator*((edges_iterator_t *)local_118);
    local_108 = (__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)local_118;
    peVar10 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(local_108);
    lVar4 = tchecker::system::edge_t::src(peVar10);
    this_01 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              ::operator*(vloc);
    peVar10 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(local_108);
    i_01 = tchecker::system::edge_t::pid(peVar10);
    puVar11 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[](this_01,i_01);
    *puVar11 = lVar4;
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)local_118);
    syncprod::edges_iterator_t::operator++((edges_iterator_t *)&__end2._sync_it);
  }
  syncprod::edges_iterator_t::~edges_iterator_t((edges_iterator_t *)&e);
  syncprod::edges_iterator_t::~edges_iterator_t((edges_iterator_t *)&__end2._sync_it);
  this_00 = vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  i_00 = 0;
  pvVar12 = range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>
            ::begin((range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>
                     *)vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  __end2_1._it._M_current = (iterator)(pvVar12->_it)._M_current;
  pvVar12 = range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>
            ::end((range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>
                   *)this_00);
  iStack_138._M_current = (pvVar12->_it)._M_current;
  while (bVar1 = cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
                 ::values_iterator_t::operator!=
                           (&__end2_1,(values_iterator_t *)&stack0xfffffffffffffec8), bVar1) {
    iVar5 = cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
            ::values_iterator_t::operator*(&__end2_1);
    vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = iVar5;
    this_02 = (make_array_t<int,_4UL,_tchecker::intval_base_t> *)
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
              ::operator*(intval);
    piVar13 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[](this_02,i_00);
    *piVar13 = iVar5;
    i_00 = i_00 + 1;
    cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
    ::values_iterator_t::operator++(&__end2_1);
  }
  pmVar6 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator->(vloc);
  uVar3 = array_capacity_t<unsigned_int>::capacity((array_capacity_t<unsigned_int> *)pmVar6);
  this = (allocator<unsigned_int> *)
         ((long)&intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158,(ulong)uVar3,this);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator*(vloc);
  copy((EVP_PKEY_CTX *)local_158,pEVar7);
  pmVar8 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator->(intval);
  uVar2 = array_capacity_t<unsigned_short>::capacity((array_capacity_t<unsigned_short> *)pmVar8);
  std::allocator<int>::allocator(&local_179);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&status,(ulong)uVar2,&local_179);
  std::allocator<int>::~allocator(&local_179);
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator*(intval);
  copy((EVP_PKEY_CTX *)&status,pEVar7);
  system_local._4_4_ =
       next(system,vloc,intval,vedge,sync_id,src_invariant,guard,reset,tgt_invariant,sync_edges_00);
  if (system_local._4_4_ == 1) {
    vloc_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc)->super_vloc_t;
    bVar1 = operator!=(vloc_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    if (!bVar1) {
      intval_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                   ::operator*(intval)->super_intval_t;
      bVar1 = operator!=(intval_00,(vector<int,_std::allocator<int>_> *)local_b0);
      if (!bVar1) {
        pEVar7 = (EVP_PKEY_CTX *)
                 intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                 ::operator*(vloc);
        copy(pEVar7,(EVP_PKEY_CTX *)local_158);
        pEVar7 = (EVP_PKEY_CTX *)
                 intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                 ::operator*(intval);
        copy(pEVar7,(EVP_PKEY_CTX *)&status);
        system_local._4_4_ = 1;
        goto LAB_0028f709;
      }
    }
    system_local._4_4_ = 2;
  }
LAB_0028f709:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&status);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  return system_local._4_4_;
}

Assistant:

tchecker::state_status_t prev(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                              tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & src_invariant,
                              tchecker::clock_constraint_container_t & guard, tchecker::clock_reset_container_t & reset,
                              tchecker::clock_constraint_container_t & tgt_invariant,
                              tchecker::ta::incoming_edges_value_t const & v)
{
  auto && [sync_edges, valuation] = v;

  // Make a copy of target vloc and intval
  std::vector<tchecker::loc_id_t> vloc_tgt(vloc->capacity());
  copy(vloc_tgt, *vloc);
  std::vector<tchecker::integer_t> intval_tgt(intval->capacity());
  copy(intval_tgt, *intval);

  // Update vloc and intval to source according to v
  for (tchecker::system::edge_const_shared_ptr_t const & e : sync_edges.edges)
    (*vloc)[e->pid()] = e->src();
  tchecker::intvar_id_t id = 0;
  for (tchecker::integer_t i : valuation) {
    (*intval)[id] = i;
    ++id;
  }

  // Make a copy of source vloc and intval
  std::vector<tchecker::loc_id_t> vloc_src(vloc->capacity());
  copy(vloc_src, *vloc);
  std::vector<tchecker::integer_t> intval_src(intval->capacity());
  copy(intval_src, *intval);

  // Apply transition forward to check enabledness and target state
  tchecker::state_status_t status =
      tchecker::ta::next(system, vloc, intval, vedge, sync_id, src_invariant, guard, reset, tgt_invariant, sync_edges);
  if (status != tchecker::STATE_OK)
    return status;

  // Check target vloc and intval are matched
  if (*vloc != vloc_tgt || *intval != intval_tgt)
    return tchecker::STATE_INCOMPATIBLE_EDGE;

  // Update to source vloc and intval
  copy(*vloc, vloc_src);
  copy(*intval, intval_src);
  return tchecker::STATE_OK;
}